

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

bool vkt::sr::(anonymous_namespace)::
     verifyGatherOffsetsCompare<tcu::Texture2DArrayView,tcu::Vector<float,3>>
               (TestLog *log,ConstPixelBufferAccess *result,Texture2DArrayView *texture,
               Vector<float,_3> (*texCoords) [4],Sampler *sampler,TexComparePrecision *compPrec,
               PixelCompareRefZ *getPixelRefZ,PixelOffsets *getPixelOffsets)

{
  void **this;
  int x;
  byte bVar1;
  bool bVar2;
  int width_00;
  int height_00;
  TestLog *pTVar3;
  float xFactor;
  float yFactor;
  float refZ_00;
  Vector<int,_2> *local_4c8;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  LogImage local_460;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  LogImage local_380;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  LogImage local_2a0;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  LogImageSet local_1c0;
  deUint32 local_180;
  Vector<bool,_4> local_17c;
  undefined1 local_178 [8];
  Vec4 idealPix;
  Vec4 resultPix;
  undefined1 local_14c [4];
  float refZ;
  Vector<float,_3> texCoord;
  Vector<float,_2> local_138;
  Vector<float,_2> local_130;
  Vector<float,_2> local_128;
  Vec2 viewportCoord;
  Vector<int,_2> local_118;
  IVec2 offsets [4];
  int local_f0;
  int px;
  int py;
  PixelBufferAccess local_d8;
  byte local_a9;
  undefined1 local_a8 [7];
  bool success;
  Surface errorMask;
  undefined1 local_80 [8];
  PixelBufferAccess idealAccess;
  Surface ideal;
  int height;
  int width;
  TexComparePrecision *compPrec_local;
  Sampler *sampler_local;
  Vector<float,_3> (*texCoords_local) [4];
  Texture2DArrayView *texture_local;
  ConstPixelBufferAccess *result_local;
  TestLog *log_local;
  
  width_00 = tcu::ConstPixelBufferAccess::getWidth(result);
  height_00 = tcu::ConstPixelBufferAccess::getWidth(result);
  this = &idealAccess.super_ConstPixelBufferAccess.m_data;
  tcu::Surface::Surface((Surface *)this,width_00,height_00);
  tcu::Surface::getAccess((PixelBufferAccess *)local_80,(Surface *)this);
  tcu::Surface::Surface((Surface *)local_a8,width_00,height_00);
  local_a9 = 1;
  tcu::Surface::getAccess(&local_d8,(Surface *)local_a8);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(&local_d8,(Vec4 *)&py);
  for (local_f0 = 0; local_f0 < height_00; local_f0 = local_f0 + 1) {
    for (offsets[3].m_data[1] = 0; offsets[3].m_data[1] < width_00;
        offsets[3].m_data[1] = offsets[3].m_data[1] + 1) {
      local_4c8 = &local_118;
      do {
        tcu::Vector<int,_2>::Vector(local_4c8);
        local_4c8 = local_4c8 + 1;
      } while (local_4c8 != offsets + 3);
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&viewportCoord,offsets[3].m_data[1],local_f0);
      (**getPixelOffsets->_vptr_PixelOffsets)(getPixelOffsets,&viewportCoord,&local_118);
      tcu::Vector<float,_2>::Vector(&local_138,(float)offsets[3].m_data[1],(float)local_f0);
      tcu::operator+((tcu *)&local_130,&local_138,0.5);
      tcu::Vector<float,_2>::Vector
                ((Vector<float,_2> *)(texCoord.m_data + 1),(float)width_00,(float)height_00);
      tcu::operator/((tcu *)&local_128,&local_130,(Vector<float,_2> *)(texCoord.m_data + 1));
      xFactor = tcu::Vector<float,_2>::x(&local_128);
      yFactor = tcu::Vector<float,_2>::y(&local_128);
      triQuadInterpolate<tcu::Vector<float,3>>
                ((_anonymous_namespace_ *)local_14c,texCoords,xFactor,yFactor);
      tcu::Vector<int,_2>::Vector
                ((Vector<int,_2> *)(resultPix.m_data + 2),offsets[3].m_data[1],local_f0);
      (**getPixelRefZ->_vptr_PixelCompareRefZ)(getPixelRefZ,resultPix.m_data + 2);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(idealPix.m_data + 2),(int)result,offsets[3].m_data[1],
                 local_f0);
      sr::anon_unknown_0::gatherOffsetsCompare
                ((Texture2DArrayView *)local_178,(Sampler *)texture,refZ_00,(Vec3 *)sampler,
                 (IVec2 (*) [4])local_14c);
      tcu::PixelBufferAccess::setPixel
                ((PixelBufferAccess *)local_80,(Vec4 *)local_178,offsets[3].m_data[1],local_f0,0);
      tcu::equal<float,4>((tcu *)&local_17c,(Vector<float,_4> *)(idealPix.m_data + 2),
                          (Vector<float,_4> *)local_178);
      bVar2 = tcu::boolAll<4>(&local_17c);
      if ((((bVar2 ^ 0xffU) & 1) != 0) &&
         (bVar2 = tcu::isGatherOffsetsCompareResultValid
                            (texture,sampler,compPrec,(Vec3 *)local_14c,(IVec2 (*) [4])&local_118,
                             refZ_00,(Vec4 *)(idealPix.m_data + 2)), x = offsets[3].m_data[1],
         !bVar2)) {
        local_180 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_a8,x,local_f0,(RGBA)local_180);
        local_a9 = 0;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"VerifyResult",&local_1e1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Verification result",&local_209);
  tcu::LogImageSet::LogImageSet(&local_1c0,&local_1e0,&local_208);
  pTVar3 = tcu::TestLog::operator<<(log,&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Rendered",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"Rendered image",&local_2e9);
  tcu::LogImage::LogImage(&local_2a0,&local_2c0,&local_2e8,result,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar3,&local_2a0);
  tcu::LogImage::~LogImage(&local_2a0);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  tcu::LogImageSet::~LogImageSet(&local_1c0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  if ((local_a9 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Reference",&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"Ideal reference image",&local_3c9);
    tcu::LogImage::LogImage
              (&local_380,&local_3a0,&local_3c8,
               (Surface *)&idealAccess.super_ConstPixelBufferAccess.m_data,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(log,&local_380);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"ErrorMask",&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"Error mask",&local_4a9)
    ;
    tcu::LogImage::LogImage
              (&local_460,&local_480,&local_4a8,(Surface *)local_a8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar3,&local_460);
    tcu::LogImage::~LogImage(&local_460);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    tcu::LogImage::~LogImage(&local_380);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
  }
  tcu::TestLog::operator<<(log,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar1 = local_a9;
  tcu::Surface::~Surface((Surface *)local_a8);
  tcu::Surface::~Surface((Surface *)&idealAccess.super_ConstPixelBufferAccess.m_data);
  return (bool)(bVar1 & 1);
}

Assistant:

static bool verifyGatherOffsetsCompare (TestLog&							log,
										const ConstPixelBufferAccess&		result,
										const TexViewT&						texture,
										const TexCoordT						(&texCoords)[4],
										const tcu::Sampler&					sampler,
										const tcu::TexComparePrecision&		compPrec,
										const PixelCompareRefZ&				getPixelRefZ,
										const PixelOffsets&					getPixelOffsets)
{
	const int					width			= result.getWidth();
	const int					height			= result.getWidth();
	tcu::Surface				ideal			(width, height);
	const PixelBufferAccess		idealAccess		= ideal.getAccess();
	tcu::Surface				errorMask		(width, height);
	bool						success			= true;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

	for (int py = 0; py < height; py++)
	for (int px = 0; px < width; px++)
	{
		IVec2		offsets[4];
		getPixelOffsets(IVec2(px, py), offsets);

		const Vec2			viewportCoord	= (Vec2((float)px, (float)py) + 0.5f) / Vec2((float)width, (float)height);
		const TexCoordT		texCoord		= triQuadInterpolate(texCoords, viewportCoord.x(), viewportCoord.y());
		const float			refZ			= getPixelRefZ(IVec2(px, py));
		const Vec4			resultPix		= result.getPixel(px, py);
		const Vec4			idealPix		= gatherOffsetsCompare(texture, sampler, refZ, texCoord, offsets);

		idealAccess.setPixel(idealPix, px, py);

		if (!tcu::boolAll(tcu::equal(resultPix, idealPix)))
		{
			if (!isGatherOffsetsCompareResultValid(texture, sampler, compPrec, texCoord, offsets, refZ, resultPix))
			{
				errorMask.setPixel(px, py, tcu::RGBA::red());
				success = false;
			}
		}
	}

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (!success)
	{
		log << TestLog::Image("Reference", "Ideal reference image", ideal)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return success;
}